

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

void __thiscall
wasm::WATParser::ParseDeclsCtx::ParseDeclsCtx(ParseDeclsCtx *this,Lexer *in,Module *wasm)

{
  Module *wasm_local;
  Lexer *in_local;
  ParseDeclsCtx *this_local;
  
  Lexer::Lexer(&this->in,in);
  this->wasm = wasm;
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::vector
            (&this->recTypeDefs);
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::vector
            (&this->typeDefs);
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::vector
            (&this->funcDefs);
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::vector
            (&this->tableDefs);
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::vector
            (&this->memoryDefs);
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::vector
            (&this->globalDefs);
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::vector
            (&this->startDefs);
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::vector
            (&this->elemDefs);
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::vector
            (&this->dataDefs);
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::vector
            (&this->tagDefs);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->exportDefs);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->implicitTypeDefs);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->implicitElemIndices);
  this->funcCounter = 0;
  this->tableCounter = 0;
  this->memoryCounter = 0;
  this->globalCounter = 0;
  this->elemCounter = 0;
  this->dataCounter = 0;
  this->tagCounter = 0;
  this->hasNonImport = false;
  return;
}

Assistant:

ParseDeclsCtx(Lexer& in, Module& wasm) : in(in), wasm(wasm) {}